

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O1

TorsionType * __thiscall
OpenMD::ForceField::getTorsionType(ForceField *this,string *at1,string *at2,string *at3,string *at4)

{
  AtomTypeContainer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer ptVar3;
  pointer ptVar4;
  ElemPtr pTVar5;
  ElemPtr this_01;
  ElemPtr this_02;
  ElemPtr this_03;
  ElemPtr this_04;
  ulong uVar6;
  pointer ppAVar7;
  pointer ppAVar8;
  int iVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  theKeys;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  foundTorsions;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at4Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at3Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at2Chain;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> at1Chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  myKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at4key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at3key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at2key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  at1key;
  string local_1c8;
  int local_1a4;
  ulong local_1a0;
  pointer local_198;
  pointer local_190;
  ulong local_188;
  TypeContainer<OpenMD::TorsionType,_4> *local_180;
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_178;
  ulong local_160;
  string *local_158;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_150;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_138;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_120;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_108;
  ForceField *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,at4);
  local_180 = &this->torsionTypeCont_;
  pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find(local_180,&local_c8);
  if (pTVar5 != (ElemPtr)0x0) goto LAB_0015f0c9;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_48,at1);
  this_00 = &this->atomTypeCont_;
  this_01 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_48);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,at2);
  this_02 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_68);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_88,at3);
  this_03 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_88);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_a8,at4);
  this_04 = TypeContainer<OpenMD::AtomType,_1>::find(this_00,&local_a8);
  AtomType::allYourBase(&local_108,this_01);
  AtomType::allYourBase(&local_120,this_02);
  AtomType::allYourBase(&local_138,this_03);
  AtomType::allYourBase(&local_150,this_04);
  local_178.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  local_178.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  local_178.
  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = local_120.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_f0 = this;
  if (local_120.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_120.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1a0 = 0;
  }
  else {
    paVar1 = &local_1c8.field_2;
    local_1a0 = 0;
    do {
      local_190 = local_138.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (local_138.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_138.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_188 = 0;
        do {
          if (local_108.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_108.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_158 = (string *)CONCAT44(local_158._4_4_,(int)local_1a0 + (int)local_188);
            local_1a4 = 0;
            ppAVar7 = local_108.
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              ppAVar8 = local_150.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              iVar9 = local_1a4;
              if (local_150.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_150.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  local_e8 = 0;
                  uStack_e0 = 0;
                  local_d8 = 0;
                  AtomType::getName_abi_cxx11_(&local_1c8,*ppAVar7);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_e8,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  AtomType::getName_abi_cxx11_(&local_1c8,*local_198);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_e8,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  AtomType::getName_abi_cxx11_(&local_1c8,*local_190);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_e8,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  AtomType::getName_abi_cxx11_(&local_1c8,*ppAVar8);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_e8,&local_1c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1c8._M_dataplus._M_p,
                                    local_1c8.field_2._M_allocated_capacity + 1);
                  }
                  pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find
                                     (local_180,(KeyType *)&local_e8);
                  if (pTVar5 != (ElemPtr)0x0) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_1c8,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_e8);
                    local_1c8.field_2._12_4_ = (int)local_158;
                    local_1c8.field_2._8_4_ = iVar9;
                    std::
                    vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ::
                    emplace_back<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                *)&local_178,
                               (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_1c8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_1c8);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_e8);
                  ppAVar8 = ppAVar8 + 1;
                  iVar9 = iVar9 + 1;
                } while (ppAVar8 !=
                         local_150.
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              local_1a4 = local_1a4 + 1;
              ppAVar7 = ppAVar7 + 1;
            } while (ppAVar7 !=
                     local_108.
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          }
          local_188 = (ulong)((int)local_188 + 1);
          local_190 = local_190 + 1;
        } while (local_190 !=
                 local_138.
                 super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      local_1a0 = (ulong)((int)local_1a0 + 1);
      local_198 = local_198 + 1;
    } while (local_198 !=
             local_120.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ptVar4 = local_178.
           super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ptVar3 = local_178.
           super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_178.
      super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_178.
      super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_198 = local_120.
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_120.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_120.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_1c8.field_2;
      local_158 = &local_f0->wildCardAtomTypeName_;
      do {
        local_190 = local_138.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        if (local_138.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_138.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_160 = 0;
          do {
            if (local_108.
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_108.
                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_1a4 = (int)local_1a0 + (int)local_160;
              local_188 = local_188 & 0xffffffff00000000;
              ppAVar7 = local_108.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                if (local_150.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    local_150.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  ppAVar8 = local_150.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  iVar9 = (int)local_188;
                  do {
                    local_e8 = 0;
                    uStack_e0 = 0;
                    local_d8 = 0;
                    AtomType::getName_abi_cxx11_(&local_1c8,*ppAVar7);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_e8,&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    AtomType::getName_abi_cxx11_(&local_1c8,*local_198);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_e8,&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    AtomType::getName_abi_cxx11_(&local_1c8,*local_190);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_e8,&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    AtomType::getName_abi_cxx11_(&local_1c8,*ppAVar8);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_e8,&local_1c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find
                                       (local_180,(KeyType *)&local_e8,local_158);
                    if (pTVar5 != (ElemPtr)0x0) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_1c8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_e8);
                      local_1c8.field_2._12_4_ = local_1a4;
                      local_1c8.field_2._8_4_ = iVar9;
                      std::
                      vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      ::
                      emplace_back<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                ((vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                  *)&local_178,
                                 (tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_1c8);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_1c8);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_e8);
                    ppAVar8 = ppAVar8 + 1;
                    iVar9 = iVar9 + 1;
                  } while (ppAVar8 !=
                           local_150.
                           super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                }
                local_188 = CONCAT44(local_188._4_4_,(int)local_188 + 1);
                ppAVar7 = ppAVar7 + 1;
              } while (ppAVar7 !=
                       local_108.
                       super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            }
            local_160 = (ulong)((int)local_160 + 1);
            local_190 = local_190 + 1;
          } while (local_190 !=
                   local_138.
                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        local_1a0 = (ulong)((int)local_1a0 + 1);
        local_198 = local_198 + 1;
      } while (local_198 !=
               local_120.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_178.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>>
                ((__normal_iterator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  )local_178.
                   super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  )local_178.
                   super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178.
                  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find
                         (local_180,(KeyType *)&local_1c8,&local_f0->wildCardAtomTypeName_);
      goto LAB_0015f00f;
    }
    pTVar5 = (ElemPtr)0x0;
  }
  else {
    uVar6 = (long)local_178.
                  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_178.
                  super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_178.
               super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_178.
               super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>*,std::vector<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::tuple<int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ptVar3,ptVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_178.
                super__Vector_base<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
    pTVar5 = TypeContainer<OpenMD::TorsionType,_4>::find(local_180,(KeyType *)&local_1c8);
LAB_0015f00f:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c8);
  }
  std::
  vector<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::tuple<int,_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~vector(&local_178);
  if (local_150.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_120.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
LAB_0015f0c9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return pTVar5;
}

Assistant:

TorsionType* ForceField::getTorsionType(const std::string& at1,
                                          const std::string& at2,
                                          const std::string& at3,
                                          const std::string& at4) {
    std::vector<std::string> keys;
    keys.push_back(at1);
    keys.push_back(at2);
    keys.push_back(at3);
    keys.push_back(at4);

    // try exact match first
    TorsionType* torsionType = torsionTypeCont_.find(keys);
    if (torsionType) {
      return torsionType;
    } else {
      AtomType* atype1;
      AtomType* atype2;
      AtomType* atype3;
      AtomType* atype4;
      std::vector<std::string> at1key;
      at1key.push_back(at1);
      atype1 = atomTypeCont_.find(at1key);

      std::vector<std::string> at2key;
      at2key.push_back(at2);
      atype2 = atomTypeCont_.find(at2key);

      std::vector<std::string> at3key;
      at3key.push_back(at3);
      atype3 = atomTypeCont_.find(at3key);

      std::vector<std::string> at4key;
      at4key.push_back(at4);
      atype4 = atomTypeCont_.find(at4key);

      // query atom types for their chains of responsibility
      std::vector<AtomType*> at1Chain = atype1->allYourBase();
      std::vector<AtomType*> at2Chain = atype2->allYourBase();
      std::vector<AtomType*> at3Chain = atype3->allYourBase();
      std::vector<AtomType*> at4Chain = atype4->allYourBase();

      std::vector<AtomType*>::iterator i;
      std::vector<AtomType*>::iterator j;
      std::vector<AtomType*>::iterator k;
      std::vector<AtomType*>::iterator l;

      int ii = 0;
      int jj = 0;
      int kk = 0;
      int ll = 0;
      int ILscore;
      int JKscore;

      std::vector<std::tuple<int, int, std::vector<std::string>>> foundTorsions;

      for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
        kk = 0;
        for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
          ii = 0;
          for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
            ll = 0;
            for (l = at4Chain.begin(); l != at4Chain.end(); ++l) {
              ILscore = ii + ll;
              JKscore = jj + kk;

              std::vector<std::string> myKeys;
              myKeys.push_back((*i)->getName());
              myKeys.push_back((*j)->getName());
              myKeys.push_back((*k)->getName());
              myKeys.push_back((*l)->getName());

              TorsionType* torsionType = torsionTypeCont_.find(myKeys);
              if (torsionType) {
                foundTorsions.push_back(
                    std::make_tuple(JKscore, ILscore, myKeys));
              }
              ll++;
            }
            ii++;
          }
          kk++;
        }
        jj++;
      }

      if (!foundTorsions.empty()) {
        std::sort(foundTorsions.begin(), foundTorsions.end());
        std::vector<std::string> theKeys = std::get<2>(foundTorsions[0]);

        TorsionType* bestType = torsionTypeCont_.find(theKeys);
        return bestType;
      } else {
        // if no exact match found, try wild card match

        for (j = at2Chain.begin(); j != at2Chain.end(); ++j) {
          kk = 0;
          for (k = at3Chain.begin(); k != at3Chain.end(); ++k) {
            ii = 0;
            for (i = at1Chain.begin(); i != at1Chain.end(); ++i) {
              ll = 0;
              for (l = at4Chain.begin(); l != at4Chain.end(); ++l) {
                ILscore = ii + ll;
                JKscore = jj + kk;

                std::vector<std::string> myKeys;
                myKeys.push_back((*i)->getName());
                myKeys.push_back((*j)->getName());
                myKeys.push_back((*k)->getName());
                myKeys.push_back((*l)->getName());

                TorsionType* torsionType =
                    torsionTypeCont_.find(myKeys, wildCardAtomTypeName_);
                if (torsionType) {
                  foundTorsions.push_back(
                      std::make_tuple(JKscore, ILscore, myKeys));
                }
                ll++;
              }
              ii++;
            }
            kk++;
          }
          jj++;
        }

        if (!foundTorsions.empty()) {
          std::sort(foundTorsions.begin(), foundTorsions.end());
          std::vector<std::string> theKeys = std::get<2>(foundTorsions[0]);
          TorsionType* bestType =
              torsionTypeCont_.find(theKeys, wildCardAtomTypeName_);

          return bestType;
        } else {
          return NULL;
        }
      }
    }
  }